

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool chi_check(double param_1,double b,double c)

{
  char *pcVar1;
  
  if (b <= 0.0) {
    pcVar1 = "  B <= 0.0.\n";
  }
  else {
    if (0.0 < c) {
      return true;
    }
    pcVar1 = "  C <= 0.0.\n";
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"CHI_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return false;
}

Assistant:

bool chi_check ( double /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_CHECK checks the parameters of the Chi CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, bool CHI_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "CHI_CHECK - Warning!\n";
    cerr << "  B <= 0.0.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cerr << " \n";
    cerr << "CHI_CHECK - Warning!\n";
    cerr << "  C <= 0.0.\n";
    return false;
  }

  return true;
}